

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall
wasm::TranslateToFuzzReader::makeNonAtomicStore(TranslateToFuzzReader *this,Type type)

{
  Random *this_00;
  __uniq_ptr_data<wasm::Memory,_std::default_delete<wasm::Memory>,_true,_true> _Var1;
  Name memory;
  int8_t iVar2;
  uint32_t uVar3;
  Index IVar4;
  BasicType BVar5;
  uint align;
  Type TVar6;
  Store *pSVar7;
  Expression *pEVar8;
  uint bytes;
  Address offset;
  Type this_01;
  long lStackY_70;
  size_t sVar9;
  char *pcVar10;
  Type local_40;
  Type type_local;
  
  local_40.id = type.id;
  if (type.id == 0) {
    local_40 = getStorableType(this);
  }
  else if (type.id == 1) {
    TVar6 = getStorableType(this);
    pSVar7 = (Store *)makeNonAtomicStore(this,TVar6);
    if ((pSVar7->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression._id != StoreId
       ) {
      return (Expression *)pSVar7;
    }
    uVar3 = Random::upTo(&this->random,3);
    if (uVar3 == 0) {
      lStackY_70 = 0x30;
    }
    else {
      if (uVar3 == 2) {
        pEVar8 = make(this,(Type)0x1);
        pSVar7->ptr = pEVar8;
      }
      else if (uVar3 != 1) goto LAB_001579bc;
      lStackY_70 = 0x38;
    }
    pEVar8 = make(this,(Type)0x1);
    *(Expression **)
     (&(pSVar7->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression._id +
     lStackY_70) = pEVar8;
LAB_001579bc:
    _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
    super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
         (((this->wasm->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
         super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>;
    pcVar10 = *(char **)((long)_Var1.
                               super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                               .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 8);
    (pSVar7->memory).super_IString.str._M_len =
         *(size_t *)
          _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
          super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
          super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
    (pSVar7->memory).super_IString.str._M_str = pcVar10;
    wasm::Store::finalize();
    return (Expression *)pSVar7;
  }
  TVar6.id = local_40.id;
  this_00 = &this->random;
  iVar2 = Random::get(this_00);
  IVar4 = logify(this,(int)iVar2);
  pEVar8 = makePointer(this);
  TVar6.id = (uintptr_t)make(this,TVar6);
  BVar5 = Type::getBasic(&local_40);
  switch(BVar5) {
  case none:
  case unreachable:
    wasm::handle_unreachable
              ("invalid type",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
               ,0xbf1);
  case i32:
    uVar3 = Random::upTo(this_00,3);
    if (uVar3 == 2) {
switchD_00157878_caseD_2:
      type_local.id = (uintptr_t)&this->builder;
      bytes = 4;
      align = Random::pick<int,int,int>(this_00,1,2,4);
      goto LAB_001579fa;
    }
    if (uVar3 == 1) goto switchD_00157878_caseD_1;
    if (uVar3 != 0) {
      wasm::handle_unreachable
                ("invalid value",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                 ,0xbc3);
    }
switchD_00157878_caseD_0:
    _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
    super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
         (((this->wasm->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
         super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>;
    sVar9 = *(size_t *)
             _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
             super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
    pcVar10 = *(char **)((long)_Var1.
                               super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                               .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 8);
    align = 1;
    this_01.id = (uintptr_t)&this->builder;
    bytes = align;
    goto LAB_00157a26;
  case i64:
    uVar3 = Random::upTo(this_00,4);
    switch(uVar3) {
    case 0:
      goto switchD_00157878_caseD_0;
    case 1:
switchD_00157878_caseD_1:
      type_local.id = (uintptr_t)&this->builder;
      bytes = 2;
      align = Random::pick<int,int>(this_00,1,2);
      break;
    case 2:
      goto switchD_00157878_caseD_2;
    case 3:
      type_local.id = (uintptr_t)&this->builder;
      bytes = 8;
      align = Random::pick<int,int,int,int>(this_00,1,2,4,8);
      break;
    default:
      wasm::handle_unreachable
                ("invalid value",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                 ,0xbd9);
    }
LAB_001579fa:
    _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
    super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
         (((this->wasm->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
         super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>;
    sVar9 = *(size_t *)
             _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
             super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
    pcVar10 = *(char **)((long)_Var1.
                               super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                               .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 8);
    this_01.id = type_local.id;
    goto LAB_00157a26;
  case f32:
    bytes = 4;
    type_local.id = TVar6.id;
    align = Random::pick<int,int,int>(this_00,1,2,4);
    _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
    super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
         (((this->wasm->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
         super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>;
    sVar9 = *(size_t *)
             _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
             super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
    pcVar10 = *(char **)((long)_Var1.
                               super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                               .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 8);
    goto LAB_0015798d;
  case f64:
    bytes = 8;
    type_local.id = TVar6.id;
    align = Random::pick<int,int,int,int>(this_00,1,2,4,8);
    break;
  case v128:
    if (((this->wasm->features).features & 8) == 0) {
      pSVar7 = (Store *)makeTrivial(this,local_40);
      return (Expression *)pSVar7;
    }
    bytes = 0x10;
    type_local.id = TVar6.id;
    align = Random::pick<int,int,int,int,int>(this_00,1,2,4,8,0x10);
    break;
  default:
    wasm::handle_unreachable
              ("invalid type",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
               ,0xbf3);
  }
  _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
  super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
       (((this->wasm->memories).
         super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->_M_t).
       super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>;
  sVar9 = *(size_t *)
           _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
           super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
  pcVar10 = *(char **)((long)_Var1.
                             super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                             .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 8);
LAB_0015798d:
  this_01.id = (uintptr_t)&this->builder;
  TVar6.id = type_local.id;
LAB_00157a26:
  offset.addr._4_4_ = 0;
  offset.addr._0_4_ = IVar4;
  memory.super_IString.str._M_str = pcVar10;
  memory.super_IString.str._M_len = sVar9;
  pSVar7 = Builder::makeStore((Builder *)this_01.id,bytes,offset,align,pEVar8,(Expression *)TVar6.id
                              ,local_40,memory);
  return (Expression *)pSVar7;
}

Assistant:

Expression* TranslateToFuzzReader::makeNonAtomicStore(Type type) {
  if (type == Type::unreachable) {
    // make a normal store, then make it unreachable
    auto* ret = makeNonAtomicStore(getStorableType());
    auto* store = ret->dynCast<Store>();
    if (!store) {
      return ret;
    }
    switch (upTo(3)) {
      case 0:
        store->ptr = make(Type::unreachable);
        break;
      case 1:
        store->value = make(Type::unreachable);
        break;
      case 2:
        store->ptr = make(Type::unreachable);
        store->value = make(Type::unreachable);
        break;
    }
    store->memory = wasm.memories[0]->name;
    store->finalize();
    return store;
  }
  // the type is none or unreachable. we also need to pick the value
  // type.
  if (type == Type::none) {
    type = getStorableType();
  }
  auto offset = logify(get());
  auto ptr = makePointer();
  auto value = make(type);
  switch (type.getBasic()) {
    case Type::i32: {
      switch (upTo(3)) {
        case 0:
          return builder.makeStore(
            1, offset, 1, ptr, value, type, wasm.memories[0]->name);
        case 1:
          return builder.makeStore(
            2, offset, pick(1, 2), ptr, value, type, wasm.memories[0]->name);
        case 2:
          return builder.makeStore(
            4, offset, pick(1, 2, 4), ptr, value, type, wasm.memories[0]->name);
      }
      WASM_UNREACHABLE("invalid value");
    }
    case Type::i64: {
      switch (upTo(4)) {
        case 0:
          return builder.makeStore(
            1, offset, 1, ptr, value, type, wasm.memories[0]->name);
        case 1:
          return builder.makeStore(
            2, offset, pick(1, 2), ptr, value, type, wasm.memories[0]->name);
        case 2:
          return builder.makeStore(
            4, offset, pick(1, 2, 4), ptr, value, type, wasm.memories[0]->name);
        case 3:
          return builder.makeStore(8,
                                   offset,
                                   pick(1, 2, 4, 8),
                                   ptr,
                                   value,
                                   type,
                                   wasm.memories[0]->name);
      }
      WASM_UNREACHABLE("invalid value");
    }
    case Type::f32: {
      return builder.makeStore(
        4, offset, pick(1, 2, 4), ptr, value, type, wasm.memories[0]->name);
    }
    case Type::f64: {
      return builder.makeStore(
        8, offset, pick(1, 2, 4, 8), ptr, value, type, wasm.memories[0]->name);
    }
    case Type::v128: {
      if (!wasm.features.hasSIMD()) {
        return makeTrivial(type);
      }
      return builder.makeStore(16,
                               offset,
                               pick(1, 2, 4, 8, 16),
                               ptr,
                               value,
                               type,
                               wasm.memories[0]->name);
    }
    case Type::none:
    case Type::unreachable:
      WASM_UNREACHABLE("invalid type");
  }
  WASM_UNREACHABLE("invalid type");
}